

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

bool spvtools::opt::(anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
               (Instruction *instruction,_func_bool_Instruction_ptr *predicate)

{
  bool bVar1;
  Op opcode;
  undefined8 in_RCX;
  anon_class_16_2_8db6b497 condition;
  undefined1 local_19 [8];
  bool found_one;
  _func_bool_Instruction_ptr *predicate_local;
  Instruction *instruction_local;
  
  unique0x1000007e = predicate;
  predicate_local = (_func_bool_Instruction_ptr *)instruction;
  opcode = Instruction::opcode(instruction);
  bVar1 = IsTypeInst(opcode);
  condition.predicate._1_7_ = (undefined7)((ulong)in_RCX >> 8);
  condition.predicate._0_1_ = bVar1;
  if (!bVar1) {
    __assert_fail("IsTypeInst(instruction->opcode()) && \"AnyTypeOf called with a non-type instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,100,
                  "bool spvtools::opt::(anonymous namespace)::AnyTypeOf(const Instruction *, UnaryPredicate) [UnaryPredicate = bool (*)(const spvtools::opt::Instruction *)]"
                 );
  }
  local_19[0] = 0;
  condition.found_one = (bool *)stack0xffffffffffffffe8;
  DFSWhile<spvtools::opt::(anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>(spvtools::opt::Instruction_const*,bool(*)(spvtools::opt::Instruction_const*))::_lambda(spvtools::opt::Instruction_const*)_1_>
            ((_anonymous_namespace_ *)predicate_local,(Instruction *)local_19,condition);
  return (bool)(local_19[0] & 1);
}

Assistant:

static bool AnyTypeOf(const Instruction* instruction,
                      UnaryPredicate predicate) {
  assert(IsTypeInst(instruction->opcode()) &&
         "AnyTypeOf called with a non-type instruction.");

  bool found_one = false;
  DFSWhile(instruction, [&found_one, predicate](const Instruction* node) {
    if (found_one || predicate(node)) {
      found_one = true;
      return false;
    }

    return true;
  });
  return found_one;
}